

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::
doWalk(TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *this)

{
  Kind KVar1;
  int iVar2;
  anon_union_8_2_a60233d5_for_Task_2 __args;
  HeapType HVar3;
  iterator __position;
  pointer pTVar4;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __tmp;
  anon_union_8_2_a60233d5_for_Task_2 aVar5;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar6;
  __hashtable *__h;
  undefined8 local_40;
  anon_union_8_2_a60233d5_for_Task_2 local_38;
  
  pTVar4 = (this->taskList).
           super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->taskList).
      super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != pTVar4) {
    do {
      KVar1 = pTVar4[-1].kind;
      __args = (anon_union_8_2_a60233d5_for_Task_2)pTVar4[-1].field_1.heapType;
      (this->taskList).
      super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar4 + -1;
      local_38 = __args;
      if (KVar1 == ScanHeapType) {
        local_40 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)CONCAT44(local_40._4_4_,5);
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
        ::push_back(&this->taskList,(value_type *)&local_40);
        if (*(char *)&this[3].taskList.
                      super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
          local_40 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)(this + 1);
          pVar6 = std::
                  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                            ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)(this + 1),__args.type,(value_type *)&local_40);
          if ((((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (HVar3.id = *(uintptr_t *)__args, 0xd < HVar3.id)) {
            iVar2 = *(int *)(HVar3.id + 0x20);
            if (iVar2 == 3) {
LAB_009c07f1:
              local_38.type = (Type *)(HVar3.id + 0x28);
              local_40 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)CONCAT44(local_40._4_4_,2);
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
              ::push_back(&this->taskList,(value_type *)&local_40);
            }
            else if (iVar2 == 2) {
              aVar5 = (anon_union_8_2_a60233d5_for_Task_2)
                      ((anon_union_8_2_a60233d5_for_Task_2 *)(HVar3.id + 0x30))->type;
              while (aVar5.type != *(Type **)(HVar3.id + 0x28)) {
                aVar5.type = aVar5.type + -2;
                local_40 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)CONCAT44(local_40._4_4_,2);
                local_38.type = aVar5.type;
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                ::push_back(&this->taskList,(value_type *)&local_40);
              }
            }
            else if (iVar2 == 1) {
              local_38.type = (Type *)(HVar3.id + 0x30);
              local_40._0_4_ = ScanType;
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
              ::push_back(&this->taskList,(value_type *)&local_40);
              goto LAB_009c07f1;
            }
          }
        }
        else {
          __position._M_current =
               (HeapType *)
               this[4].taskList.
               super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start;
          if ((pointer)__position._M_current ==
              this[4].taskList.
              super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                       &this[3].taskList.
                        super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,__position,
                       __args.heapType);
          }
          else {
            (__position._M_current)->id = (__args.type)->id;
            this[4].taskList.
            super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)(__position._M_current + 1);
          }
        }
        local_40 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)CONCAT44(local_40._4_4_,1);
LAB_009c0803:
        local_38 = __args;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
        ::push_back(&this->taskList,(value_type *)&local_40);
      }
      else if (KVar1 == ScanType) {
        local_40._0_4_ = PostType;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
        ::push_back(&this->taskList,(value_type *)&local_40);
        HVar3.id = *(uintptr_t *)__args;
        *(undefined1 *)
         &this[3].taskList.
          super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish = 0;
        if (6 < HVar3.id) {
          if (*(int *)(HVar3.id + 4) == 1) {
            local_38.type = (Type *)(HVar3.id + 8);
            local_40._0_4_ = ScanHeapType;
            std::
            vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
            ::push_back(&this->taskList,(value_type *)&local_40);
          }
          else if (*(int *)(HVar3.id + 4) == 0) {
            aVar5 = (anon_union_8_2_a60233d5_for_Task_2)
                    ((anon_union_8_2_a60233d5_for_Task_2 *)(HVar3.id + 0x10))->type;
            while (aVar5.type != *(Type **)(HVar3.id + 8)) {
              aVar5.type = aVar5.type + -1;
              local_40._0_4_ = ScanType;
              local_38.type = aVar5.type;
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
              ::push_back(&this->taskList,(value_type *)&local_40);
            }
          }
        }
        local_40 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)((ulong)local_40._4_4_ << 0x20);
        goto LAB_009c0803;
      }
      pTVar4 = (this->taskList).
               super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->taskList).
             super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start != pTVar4);
  }
  return;
}

Assistant:

void TypeGraphWalkerBase<Self>::doWalk() {
  while (!taskList.empty()) {
    auto curr = taskList.back();
    taskList.pop_back();
    switch (curr.kind) {
      case Task::PreType:
        self().preVisitType(curr.type);
        break;
      case Task::PreHeapType:
        self().preVisitHeapType(curr.heapType);
        break;
      case Task::ScanType:
        taskList.push_back(Task::postVisit(curr.type));
        self().scanType(curr.type);
        taskList.push_back(Task::preVisit(curr.type));
        break;
      case Task::ScanHeapType:
        taskList.push_back(Task::postVisit(curr.heapType));
        self().scanHeapType(curr.heapType);
        taskList.push_back(Task::preVisit(curr.heapType));
        break;
      case Task::PostType:
        self().postVisitType(curr.type);
        break;
      case Task::PostHeapType:
        self().postVisitHeapType(curr.heapType);
        break;
    }
  }
}